

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindow * CreateNewWindow(char *name,ImGuiWindowFlags flags)

{
  int iVar1;
  ImGuiWindow *this;
  ImGuiWindowSettings *p;
  bool local_69;
  ImGuiWindowSettings *settings;
  ImGuiWindow *local_28;
  ImGuiWindow *window;
  ImGuiContext *g;
  char *pcStack_10;
  ImGuiWindowFlags flags_local;
  char *name_local;
  
  window = (ImGuiWindow *)GImGui;
  g._4_4_ = flags;
  pcStack_10 = name;
  ImGui::MemAlloc(0x418);
  this = (ImGuiWindow *)operator_new(0x418);
  ImGuiWindow::ImGuiWindow(this,(ImGuiContext *)window,pcStack_10);
  this->Flags = g._4_4_;
  local_28 = this;
  ImGuiStorage::SetVoidPtr((ImGuiStorage *)&window[6].DC.ItemWidthStack.Data,this->ID,this);
  ImVec2::ImVec2((ImVec2 *)((long)&settings + 4),60.0,60.0);
  local_28->Pos = stack0xffffffffffffffbc;
  if (((g._4_4_ & 0x100) == 0) &&
     (p = ImGui::FindWindowSettings(local_28->ID), p != (ImGuiWindowSettings *)0x0)) {
    iVar1 = ImChunkStream<ImGuiWindowSettings>::offset_from_ptr
                      ((ImChunkStream<ImGuiWindowSettings> *)
                       &window[0xb].DrawListInst._TextureIdStack.Data,p);
    local_28->SettingsOffset = iVar1;
    SetWindowConditionAllowFlags(local_28,4,false);
    ApplyWindowSettings(local_28,p);
  }
  (local_28->DC).CursorMaxPos = local_28->Pos;
  (local_28->DC).CursorStartPos = (local_28->DC).CursorMaxPos;
  if ((g._4_4_ & 0x40) == 0) {
    if ((local_28->Size).x <= 0.0) {
      local_28->AutoFitFramesX = '\x02';
    }
    if ((local_28->Size).y <= 0.0) {
      local_28->AutoFitFramesY = '\x02';
    }
    local_69 = true;
    if (local_28->AutoFitFramesX < '\x01') {
      local_69 = '\0' < local_28->AutoFitFramesY;
    }
    local_28->AutoFitOnlyGrows = local_69;
  }
  else {
    local_28->AutoFitFramesY = '\x02';
    local_28->AutoFitFramesX = '\x02';
    local_28->AutoFitOnlyGrows = false;
  }
  ImVector<ImGuiWindow_*>::push_back
            ((ImVector<ImGuiWindow_*> *)&window[6].DC.FocusCounterRegular,&local_28);
  if ((g._4_4_ & 0x2000) == 0) {
    ImVector<ImGuiWindow_*>::push_back
              ((ImVector<ImGuiWindow_*> *)&window[6].DC.CurrentColumns,&local_28);
  }
  else {
    ImVector<ImGuiWindow_*>::push_front
              ((ImVector<ImGuiWindow_*> *)&window[6].DC.CurrentColumns,&local_28);
  }
  return local_28;
}

Assistant:

static ImGuiWindow* CreateNewWindow(const char* name, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    //IMGUI_DEBUG_LOG("CreateNewWindow '%s', flags = 0x%08X\n", name, flags);

    // Create window the first time
    ImGuiWindow* window = IM_NEW(ImGuiWindow)(&g, name);
    window->Flags = flags;
    g.WindowsById.SetVoidPtr(window->ID, window);

    // Default/arbitrary window position. Use SetNextWindowPos() with the appropriate condition flag to change the initial position of a window.
    window->Pos = ImVec2(60, 60);

    // User can disable loading and saving of settings. Tooltip and child windows also don't store settings.
    if (!(flags & ImGuiWindowFlags_NoSavedSettings))
        if (ImGuiWindowSettings* settings = ImGui::FindWindowSettings(window->ID))
        {
            // Retrieve settings from .ini file
            window->SettingsOffset = g.SettingsWindows.offset_from_ptr(settings);
            SetWindowConditionAllowFlags(window, ImGuiCond_FirstUseEver, false);
            ApplyWindowSettings(window, settings);
        }
    window->DC.CursorStartPos = window->DC.CursorMaxPos = window->Pos; // So first call to CalcContentSize() doesn't return crazy values

    if ((flags & ImGuiWindowFlags_AlwaysAutoResize) != 0)
    {
        window->AutoFitFramesX = window->AutoFitFramesY = 2;
        window->AutoFitOnlyGrows = false;
    }
    else
    {
        if (window->Size.x <= 0.0f)
            window->AutoFitFramesX = 2;
        if (window->Size.y <= 0.0f)
            window->AutoFitFramesY = 2;
        window->AutoFitOnlyGrows = (window->AutoFitFramesX > 0) || (window->AutoFitFramesY > 0);
    }

    g.WindowsFocusOrder.push_back(window);
    if (flags & ImGuiWindowFlags_NoBringToFrontOnFocus)
        g.Windows.push_front(window); // Quite slow but rare and only once
    else
        g.Windows.push_back(window);
    return window;
}